

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val)

{
  container_t *pcVar1;
  container_t *c;
  array_container_t *new_typecode;
  undefined4 in_ESI;
  roaring_array_t *in_RDI;
  container_t *container_1;
  array_container_t *newac;
  container_t *container2;
  uint8_t newtypecode;
  container_t *container;
  uint8_t typecode;
  int i;
  uint16_t hb;
  roaring_array_t *ra;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  uint8_t in_stack_ffffffffffffffaf;
  roaring_array_t *in_stack_ffffffffffffffb0;
  uint8_t *in_stack_ffffffffffffffb8;
  roaring_array_t *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  uint8_t local_21;
  int32_t local_20;
  undefined2 local_1a;
  roaring_array_t *local_18;
  roaring_array_t *local_8;
  
  local_1a = (undefined2)((uint)in_ESI >> 0x10);
  local_18 = in_RDI;
  local_8 = in_RDI;
  local_20 = ra_get_index((roaring_array_t *)
                          CONCAT17(in_stack_ffffffffffffffaf,
                                   CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)),0)
  ;
  if (local_20 < 0) {
    new_typecode = array_container_create();
    pcVar1 = container_add((container_t *)
                           CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                           (uint16_t)((ulong)in_stack_ffffffffffffffc0 >> 0x30),
                           (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x28),
                           (uint8_t *)new_typecode);
    ra_insert_new_key_value_at
              (in_stack_ffffffffffffffc0,(int32_t)((ulong)new_typecode >> 0x20),
               (uint16_t)((ulong)new_typecode >> 0x10),pcVar1,in_stack_ffffffffffffffaf);
  }
  else {
    ra_unshare_container_at_index
              (in_stack_ffffffffffffffb0,
               CONCAT11(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae));
    pcVar1 = ra_get_container_at_index(local_18,(uint16_t)local_20,&local_21);
    c = container_add((container_t *)CONCAT17(local_21,in_stack_ffffffffffffffc8),
                      (uint16_t)((ulong)in_stack_ffffffffffffffc0 >> 0x30),
                      (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x28),in_stack_ffffffffffffffb8)
    ;
    if (c != pcVar1) {
      container_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
      ra_set_container_at_index(local_8,local_20,c,local_21);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add(roaring_bitmap_t *r, uint32_t val) {
    roaring_array_t *ra = &r->high_low_container;

    const uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(ra, (uint16_t)i);
        container_t *container =
            ra_get_container_at_index(ra, (uint16_t)i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container =
            container_add(newac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
    }
}